

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_hermite(HairSetNode *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vec3fx *pVVar3;
  undefined8 uVar4;
  size_t sVar5;
  long lVar6;
  Vec3fx *pVVar7;
  pointer pHVar8;
  uint uVar9;
  ulong uVar10;
  pointer pvVar11;
  ulong uVar12;
  Hair HVar13;
  ulong uVar14;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  pt;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  local_70;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::resize(&this->tangents,
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
    pvVar11 = (this->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar11) {
      uVar14 = 0;
      do {
        bezier_to_hermite_helper(&local_70,&this->hairs,pvVar11 + uVar14);
        sVar5 = local_70.first.size_active;
        pvVar11 = (this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = pvVar11[uVar14].size_alloced;
        uVar12 = uVar10;
        if ((uVar10 < local_70.first.size_active) &&
           (uVar12 = local_70.first.size_active, uVar10 != 0)) {
          while (uVar12 = uVar10, uVar12 < local_70.first.size_active) {
            uVar10 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
          }
        }
        if (local_70.first.size_active < pvVar11[uVar14].size_active) {
          pvVar11[uVar14].size_active = local_70.first.size_active;
        }
        if (pvVar11[uVar14].size_alloced == uVar12) {
          pvVar11[uVar14].size_active = local_70.first.size_active;
        }
        else {
          pVVar3 = pvVar11[uVar14].items;
          pVVar7 = (Vec3fx *)alignedMalloc(uVar12 << 4,0x10);
          pvVar11[uVar14].items = pVVar7;
          if (pvVar11[uVar14].size_active != 0) {
            lVar6 = 0;
            uVar10 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar6);
              uVar4 = puVar2[1];
              puVar1 = (undefined8 *)((long)&(pvVar11[uVar14].items)->field_0 + lVar6);
              *puVar1 = *puVar2;
              puVar1[1] = uVar4;
              uVar10 = uVar10 + 1;
              lVar6 = lVar6 + 0x10;
            } while (uVar10 < pvVar11[uVar14].size_active);
          }
          alignedFree(pVVar3);
          pvVar11[uVar14].size_active = sVar5;
          pvVar11[uVar14].size_alloced = uVar12;
        }
        sVar5 = local_70.second.size_active;
        if (pvVar11[uVar14].size_active != 0) {
          lVar6 = 0;
          uVar10 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(local_70.first.items)->field_0 + lVar6);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)&(pvVar11[uVar14].items)->field_0 + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            uVar10 = uVar10 + 1;
            lVar6 = lVar6 + 0x10;
          } while (uVar10 < pvVar11[uVar14].size_active);
        }
        pvVar11 = (this->tangents).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = pvVar11[uVar14].size_alloced;
        uVar12 = uVar10;
        if ((uVar10 < local_70.second.size_active) &&
           (uVar12 = local_70.second.size_active, uVar10 != 0)) {
          while (uVar12 = uVar10, uVar12 < local_70.second.size_active) {
            uVar10 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
          }
        }
        if (local_70.second.size_active < pvVar11[uVar14].size_active) {
          pvVar11[uVar14].size_active = local_70.second.size_active;
        }
        if (pvVar11[uVar14].size_alloced == uVar12) {
          pvVar11[uVar14].size_active = local_70.second.size_active;
        }
        else {
          pVVar3 = pvVar11[uVar14].items;
          pVVar7 = (Vec3fx *)alignedMalloc(uVar12 << 4,0x10);
          pvVar11[uVar14].items = pVVar7;
          if (pvVar11[uVar14].size_active != 0) {
            lVar6 = 0;
            uVar10 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar6);
              uVar4 = puVar2[1];
              puVar1 = (undefined8 *)((long)&(pvVar11[uVar14].items)->field_0 + lVar6);
              *puVar1 = *puVar2;
              puVar1[1] = uVar4;
              uVar10 = uVar10 + 1;
              lVar6 = lVar6 + 0x10;
            } while (uVar10 < pvVar11[uVar14].size_active);
          }
          alignedFree(pVVar3);
          pvVar11[uVar14].size_active = sVar5;
          pvVar11[uVar14].size_alloced = uVar12;
        }
        if (pvVar11[uVar14].size_active != 0) {
          lVar6 = 0;
          uVar10 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(local_70.second.items)->field_0 + lVar6);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)&(pvVar11[uVar14].items)->field_0 + lVar6);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            uVar10 = uVar10 + 1;
            lVar6 = lVar6 + 0x10;
          } while (uVar10 < pvVar11[uVar14].size_active);
        }
        alignedFree(local_70.second.items);
        local_70.second.size_active = 0;
        local_70.second.size_alloced = 0;
        local_70.second.items = (Vec3fx *)0x0;
        alignedFree(local_70.first.items);
        local_70.first.size_active = 0;
        local_70.first.size_alloced = 0;
        local_70.first.items = (Vec3fx *)0x0;
        uVar14 = uVar14 + 1;
        pvVar11 = (this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(this->positions).
                                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >>
                               5));
    }
    pHVar8 = (this->hairs).
             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->hairs).
        super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar8) {
      uVar9 = 0;
      uVar14 = 0;
      do {
        HVar13.id = 0;
        HVar13.vertex = uVar9;
        pHVar8[uVar14] = HVar13;
        uVar14 = uVar14 + 1;
        pHVar8 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = uVar9 + 2;
      } while (uVar14 < (ulong)((long)(this->hairs).
                                      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3
                               ));
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_hermite()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    tangents.resize(numTimeSteps());
    for (size_t i=0; i<positions.size(); i++) {
      auto pt = bezier_to_hermite_helper(hairs,positions[i]);
      positions[i] = pt.first;
      tangents[i] = pt.second;
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(2*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }